

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

size_t enet_list_size(ENetList *list)

{
  size_t sVar1;
  _ENetListNode *p_Var2;
  
  sVar1 = 0xffffffffffffffff;
  p_Var2 = &list->sentinel;
  do {
    p_Var2 = ((ENetListNode *)&p_Var2->next)->next;
    sVar1 = sVar1 + 1;
  } while (p_Var2 != &list->sentinel);
  return sVar1;
}

Assistant:

size_t
enet_list_size (ENetList * list)
{
   size_t size = 0;
   ENetListIterator position;

   for (position = enet_list_begin (list);
        position != enet_list_end (list);
        position = enet_list_next (position))
     ++ size;
   
   return size;
}